

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall Assimp::ValidateDSProcess::ReportError(ValidateDSProcess *this,char *msg,...)

{
  char in_AL;
  uint uVar1;
  runtime_error *this_00;
  long *plVar2;
  undefined8 in_RCX;
  long *plVar3;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char szBuffer [3000];
  long *local_cf8;
  long local_cf0;
  long local_ce8;
  long lStack_ce0;
  undefined1 *local_cd8 [2];
  undefined1 local_cc8 [16];
  undefined8 local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  undefined1 local_c98 [16];
  undefined8 local_c88;
  undefined8 local_c80;
  undefined8 local_c78;
  undefined8 local_c70;
  undefined4 local_c68;
  undefined8 local_c58;
  undefined8 local_c48;
  undefined8 local_c38;
  undefined8 local_c28;
  undefined8 local_c18;
  undefined8 local_c08;
  undefined8 local_bf8;
  char local_be8 [3008];
  
  if (in_AL != '\0') {
    local_c68 = in_XMM0_Da;
    local_c58 = in_XMM1_Qa;
    local_c48 = in_XMM2_Qa;
    local_c38 = in_XMM3_Qa;
    local_c28 = in_XMM4_Qa;
    local_c18 = in_XMM5_Qa;
    local_c08 = in_XMM6_Qa;
    local_bf8 = in_XMM7_Qa;
  }
  local_c88 = in_RDX;
  local_c80 = in_RCX;
  local_c78 = in_R8;
  local_c70 = in_R9;
  if (msg == (char *)0x0) {
    __assert_fail("__null != msg",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                  ,0x51,"void Assimp::ValidateDSProcess::ReportError(const char *, ...)");
  }
  local_ca8 = local_c98;
  local_cb0 = &stack0x00000008;
  local_cb8 = 0x3000000010;
  uVar1 = vsprintf(local_be8,msg,&local_cb8);
  if (0 < (int)uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_cd8[0] = local_cc8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,local_be8,local_be8 + uVar1)
    ;
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_cd8,0,(char *)0x0,0x6c5dd9);
    local_cf8 = (long *)*plVar2;
    plVar3 = plVar2 + 2;
    if (local_cf8 == plVar3) {
      local_ce8 = *plVar3;
      lStack_ce0 = plVar2[3];
      local_cf8 = &local_ce8;
    }
    else {
      local_ce8 = *plVar3;
    }
    local_cf0 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_cf8);
    *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  __assert_fail("iLen > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                ,0x58,"void Assimp::ValidateDSProcess::ReportError(const char *, ...)");
}

Assistant:

AI_WONT_RETURN void ValidateDSProcess::ReportError(const char* msg,...)
{
    ai_assert(NULL != msg);

    va_list args;
    va_start(args,msg);

    char szBuffer[3000];
    const int iLen = vsprintf(szBuffer,msg,args);
    ai_assert(iLen > 0);

    va_end(args);

    throw DeadlyImportError("Validation failed: " + std::string(szBuffer,iLen));
}